

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

string * __thiscall MlmWrap::error(MlmWrap *this,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"[MlmWrap:",&local_79);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return __lhs;
}

Assistant:

std::string MlmWrap::error(const std::string s){
    return std::string("[MlmWrap:") + id + "] " + s;
}